

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O2

BoxList * __thiscall amrex::BoxList::removeEmpty(BoxList *this)

{
  Box *pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  const_iterator __first;
  Box *this_00;
  long lVar8;
  pointer this_01;
  Box *pBVar7;
  
  this_01 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar1 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar8 = (long)pBVar1 - (long)this_01;
  for (lVar6 = lVar8 / 0x1c >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar5 = Box::isEmpty(this_01);
    __first._M_current = this_01;
    if (bVar5) goto LAB_004177a3;
    bVar5 = Box::isEmpty(this_01 + 1);
    __first._M_current = this_01 + 1;
    if (bVar5) goto LAB_004177a3;
    bVar5 = Box::isEmpty(this_01 + 2);
    __first._M_current = this_01 + 2;
    if (bVar5) goto LAB_004177a3;
    bVar5 = Box::isEmpty(this_01 + 3);
    __first._M_current = this_01 + 3;
    if (bVar5) goto LAB_004177a3;
    this_01 = this_01 + 4;
    lVar8 = lVar8 + -0x70;
  }
  lVar8 = lVar8 / 0x1c;
  if (lVar8 == 1) {
LAB_00417792:
    bVar5 = Box::isEmpty(this_01);
    __first._M_current = this_01;
    if (!bVar5) {
      __first._M_current = pBVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_00417782:
    bVar5 = Box::isEmpty(this_01);
    __first._M_current = this_01;
    if (!bVar5) {
      this_01 = this_01 + 1;
      goto LAB_00417792;
    }
  }
  else {
    __first._M_current = pBVar1;
    if (lVar8 != 3) goto LAB_004177e2;
    bVar5 = Box::isEmpty(this_01);
    __first._M_current = this_01;
    if (!bVar5) {
      this_01 = this_01 + 1;
      goto LAB_00417782;
    }
  }
LAB_004177a3:
  this_00 = __first._M_current;
  if (__first._M_current != pBVar1) {
    while (pBVar7 = this_00, this_00 = pBVar7 + 1, this_00 != pBVar1) {
      bVar5 = Box::isEmpty(this_00);
      if (!bVar5) {
        uVar2 = *(undefined8 *)(this_00->smallend).vect;
        uVar3 = *(undefined8 *)(pBVar7[1].smallend.vect + 2);
        uVar4 = *(undefined8 *)(pBVar7[1].bigend.vect + 2);
        *(undefined8 *)((__first._M_current)->bigend).vect = *(undefined8 *)pBVar7[1].bigend.vect;
        *(undefined8 *)(((__first._M_current)->bigend).vect + 2) = uVar4;
        *(undefined8 *)((__first._M_current)->smallend).vect = uVar2;
        *(undefined8 *)(((__first._M_current)->smallend).vect + 2) = uVar3;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_004177e2:
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::erase
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)this,__first,
             (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return this;
}

Assistant:

BoxList&
BoxList::removeEmpty()
{
    m_lbox.erase(std::remove_if(m_lbox.begin(), m_lbox.end(),
                                [](const Box& x) { return x.isEmpty(); }),
                 m_lbox.end());
    return *this;
}